

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderSharedVarTests::init(ShaderSharedVarTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  DataType DVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  SharedBasicVarCase *pSVar3;
  char *pcVar4;
  long *plVar5;
  ShaderAtomicOpTests *this_00;
  long *plVar6;
  Precision precision;
  DataType dataType;
  UVec3 workGroupSize;
  UVec3 workGroupSize_1;
  undefined1 local_b0 [16];
  long local_a0;
  long lStack_98;
  allocator<char> local_89;
  TestNode *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  UVec3 local_5c;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic_type",
             "Basic Types");
  local_88 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  dataType = TYPE_FLOAT;
  do {
    DVar1 = glu::getDataTypeScalarType(dataType);
    if (DVar1 != TYPE_DOUBLE) {
      if (dataType - TYPE_BOOL < 4) {
        local_b0._0_8_ = (long *)0x100000002;
        local_b0._8_4_ = 3;
        pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
        context = (this->super_TestCaseGroup).m_context;
        pcVar4 = glu::getDataTypeName(dataType);
        SharedBasicVarCase::SharedBasicVarCase
                  (pSVar3,context,pcVar4,dataType,PRECISION_LAST,(UVec3 *)local_b0);
        tcu::TestNode::addChild(local_88,(TestNode *)pSVar3);
      }
      else {
        precision = PRECISION_LOWP;
        do {
          local_5c.m_data[0] = 2;
          local_5c.m_data[1] = 1;
          local_5c.m_data[2] = 3;
          pcVar4 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar4,&local_89);
          plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_70 = *plVar6;
            lStack_68 = plVar5[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar6;
            local_80 = (long *)*plVar5;
          }
          local_78 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          glu::getPrecisionName(precision);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = plVar5[3];
            local_b0._0_8_ = &local_a0;
          }
          else {
            local_a0 = *plVar6;
            local_b0._0_8_ = (long *)*plVar5;
          }
          local_b0._8_8_ = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
          SharedBasicVarCase::SharedBasicVarCase
                    (pSVar3,(this->super_TestCaseGroup).m_context,(char *)local_b0._0_8_,dataType,
                     precision,&local_5c);
          tcu::TestNode::addChild(local_88,(TestNode *)pSVar3);
          if ((long *)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,local_a0 + 1);
          }
          precision = precision + PRECISION_MEDIUMP;
        } while (precision != PRECISION_LAST);
      }
    }
    dataType = dataType + TYPE_FLOAT;
  } while (dataType != TYPE_SAMPLER_1D);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "work_group_size","Shared Variables with Various Work Group Sizes");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_1_1",TYPE_FLOAT,PRECISION_HIGHP,
             (UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x40;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_64_1_1",TYPE_FLOAT,PRECISION_HIGHP,
             (UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x40;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_64_1",TYPE_FLOAT,PRECISION_HIGHP,
             (UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_1_64",TYPE_FLOAT,PRECISION_HIGHP,
             (UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x80;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_128_1_1",TYPE_FLOAT,PRECISION_HIGHP
             ,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x80;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_128_1",TYPE_FLOAT,PRECISION_HIGHP
             ,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0xd;
  local_b0._4_4_ = 2;
  local_b0._8_4_ = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_13_2_4",TYPE_FLOAT,PRECISION_HIGHP,
             (UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x40;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_64_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x40;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_64_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_1_64",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x80;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_128_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x80;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_128_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0xd;
  local_b0._4_4_ = 2;
  local_b0._8_4_ = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_13_2_4",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x40;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_64_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x40;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_64_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_8_ = &DAT_100000001;
  local_b0._8_4_ = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_1_64",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0x80;
  local_b0._4_4_ = 1;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_128_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 1;
  local_b0._4_4_ = 0x80;
  local_b0._8_4_ = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_128_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  local_b0._0_4_ = 0xd;
  local_b0._4_4_ = 2;
  local_b0._8_4_ = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_13_2_4",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,(UVec3 *)local_b0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  this_00 = (ShaderAtomicOpTests *)operator_new(0x80);
  ShaderAtomicOpTests::ShaderAtomicOpTests
            (this_00,(this->super_TestCaseGroup).m_context,"atomic",ATOMIC_OPERAND_SHARED_VARIABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void ShaderSharedVarTests::init (void)
{
	// .basic_type
	{
		tcu::TestCaseGroup *const basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_type", "Basic Types");
		addChild(basicTypeGroup);

		for (int basicType = TYPE_FLOAT; basicType <= TYPE_BOOL_VEC4; basicType++)
		{
			if (glu::getDataTypeScalarType(DataType(basicType)) == glu::TYPE_DOUBLE)
				continue;

			if (glu::isDataTypeBoolOrBVec(DataType(basicType)))
			{
				const tcu::UVec3	workGroupSize	(2,1,3);
				basicTypeGroup->addChild(new SharedBasicVarCase(m_context, getDataTypeName(DataType(basicType)), DataType(basicType), PRECISION_LAST, workGroupSize));
			}
			else
			{
				for (int precision = 0; precision < PRECISION_LAST; precision++)
				{
					const tcu::UVec3	workGroupSize	(2,1,3);
					const string		name			= string(getDataTypeName(DataType(basicType))) + "_" + getPrecisionName(Precision(precision));

					basicTypeGroup->addChild(new SharedBasicVarCase(m_context, name.c_str(), DataType(basicType), Precision(precision), workGroupSize));
				}
			}
		}
	}

	// .work_group_size
	{
		tcu::TestCaseGroup *const workGroupSizeGroup = new tcu::TestCaseGroup(m_testCtx, "work_group_size", "Shared Variables with Various Work Group Sizes");
		addChild(workGroupSizeGroup);

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_64_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_64_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_64",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_128_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_128_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_13_2_4",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_64_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_64_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_64",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_128_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_128_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_13_2_4",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_64_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_64_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_64",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_128_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_128_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_13_2_4",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));
	}

	// .atomic
	addChild(new ShaderAtomicOpTests(m_context, "atomic", ATOMIC_OPERAND_SHARED_VARIABLE));
}